

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_CreateFlopSetReset
              (Cba_Ntk_t *p,Prs_Ntk_t *pNtk,Vec_Int_t *vBox,int *pIndexSet,int *pIndexRst,
              int *pBitSet,int *pBitRst)

{
  Cba_Man_t *pCVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  long lVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  long lVar10;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  
  pCVar1 = p->pDesign;
  if (0 < (pCVar1->vUsed2).nSize) {
    piVar2 = (pCVar1->vUsed2).pArray;
    lVar8 = 0;
    do {
      iVar7 = piVar2[lVar8];
      if (((long)iVar7 < 0) || ((pCVar1->vNameMap2).nSize <= iVar7)) goto LAB_003bb6c7;
      (pCVar1->vNameMap2).pArray[iVar7] = 0;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pCVar1->vUsed2).nSize);
  }
  (pCVar1->vUsed2).nSize = 0;
  uVar4 = Abc_NamStrFind(pCVar1->pStrs,"set");
  pCVar1 = p->pDesign;
  Vec_IntFillExtra(&pCVar1->vNameMap2,uVar4 + 1,Fill);
  if ((-1 < (int)uVar4) && ((int)uVar4 < (pCVar1->vNameMap2).nSize)) {
    if ((pCVar1->vNameMap2).pArray[uVar4] != 0) {
LAB_003bb6e6:
      __assert_fail("Vec_IntGetEntry(&p->vNameMap2, i) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0x328,"void Cba_ManSetMap2(Cba_Man_t *, int, int)");
    }
    Vec_IntFillExtra(&pCVar1->vNameMap2,uVar4 + 1,Fill_00);
    if ((int)uVar4 < (pCVar1->vNameMap2).nSize) {
      (pCVar1->vNameMap2).pArray[uVar4] = 1;
      Vec_IntPush(&pCVar1->vUsed2,uVar4);
      uVar4 = Abc_NamStrFind(p->pDesign->pStrs,"reset");
      pCVar1 = p->pDesign;
      Vec_IntFillExtra(&pCVar1->vNameMap2,uVar4 + 1,Fill_01);
      if (((int)uVar4 < 0) || ((pCVar1->vNameMap2).nSize <= (int)uVar4)) goto LAB_003bb6a8;
      if ((pCVar1->vNameMap2).pArray[uVar4] != 0) goto LAB_003bb6e6;
      Vec_IntFillExtra(&pCVar1->vNameMap2,uVar4 + 1,Fill_02);
      if ((int)uVar4 < (pCVar1->vNameMap2).nSize) {
        (pCVar1->vNameMap2).pArray[uVar4] = 2;
        Vec_IntPush(&pCVar1->vUsed2,uVar4);
        if (1 < vBox->nSize) {
          local_64 = -1;
          lVar8 = 1;
          local_60 = -1;
          local_5c = -1;
          local_68 = -1;
          uVar9 = extraout_RDX;
          do {
            iVar7 = vBox->pArray[lVar8 + -1];
            lVar10 = (long)iVar7;
            iVar5 = vBox->pArray[lVar8];
            pCVar1 = p->pDesign;
            Vec_IntFillExtra(&pCVar1->vNameMap2,iVar7 + 1,(int)uVar9);
            if ((lVar10 < 0) || ((pCVar1->vNameMap2).nSize <= iVar7)) goto LAB_003bb6a8;
            uVar9 = extraout_RDX_00;
            iVar6 = iVar5;
            iVar3 = (int)lVar8;
            if ((pCVar1->vNameMap2).pArray[lVar10] != 1) {
              pCVar1 = p->pDesign;
              Vec_IntFillExtra(&pCVar1->vNameMap2,iVar7 + 1,(int)extraout_RDX_00);
              if ((pCVar1->vNameMap2).nSize <= iVar7) goto LAB_003bb6a8;
              uVar9 = extraout_RDX_01;
              iVar6 = local_64;
              iVar3 = local_5c;
              if ((pCVar1->vNameMap2).pArray[lVar10] == 2) {
                local_68 = iVar5;
                local_60 = (int)lVar8;
              }
            }
            local_5c = iVar3;
            local_64 = iVar6;
            lVar8 = lVar8 + 2;
          } while ((int)lVar8 < vBox->nSize);
          if ((-1 < local_64) && (-1 < local_68)) {
            if (pIndexSet != (int *)0x0) {
              *pBitSet = 0;
            }
            if (pIndexRst != (int *)0x0) {
              *pBitRst = 0;
            }
            if (pBitSet != (int *)0x0) {
              *pBitSet = 0;
            }
            if (pBitRst != (int *)0x0) {
              *pBitRst = 0;
            }
            iVar5 = Prs_CreateBitSignal(pNtk,local_64);
            iVar6 = Prs_CreateBitSignal(pNtk,local_68);
            iVar7 = 0;
            if ((iVar5 != -1) && (iVar7 = 0, iVar6 != -1)) {
              if (pIndexSet != (int *)0x0) {
                *pIndexSet = local_5c;
              }
              if (pIndexRst != (int *)0x0) {
                *pIndexRst = local_60;
              }
              if (pBitSet != (int *)0x0) {
                *pBitSet = iVar5;
              }
              iVar7 = 1;
              if (pBitRst != (int *)0x0) {
                *pBitRst = iVar6;
              }
            }
            return iVar7;
          }
        }
        __assert_fail("iSigSet >= 0 && iSigRst >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x6a5,
                      "int Prs_CreateFlopSetReset(Cba_Ntk_t *, Prs_Ntk_t *, Vec_Int_t *, int *, int *, int *, int *)"
                     );
      }
    }
LAB_003bb6c7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_003bb6a8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Prs_CreateFlopSetReset( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, Vec_Int_t * vBox, int * pIndexSet, int * pIndexRst, int * pBitSet, int * pBitRst )
{
    int iSigSet = -1, iSigRst = -1;
    int IndexSet = -1, IndexRst = -1;
    int FormId, ActId, k;
    // mark set and reset
    Cba_NtkCleanMap2( p );
    Cba_NtkSetMap2( p, Cba_NtkStrId(p, "set"), 1 );
    Cba_NtkSetMap2( p, Cba_NtkStrId(p, "reset"), 2 );
    // check the inputs
    Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
        if ( Cba_NtkGetMap2(p, FormId) == 1 ) // set
            iSigSet = ActId, IndexSet = k+1;
        else if ( Cba_NtkGetMap2(p, FormId) == 2 ) // reset
            iSigRst = ActId, IndexRst = k+1;
    assert( iSigSet >= 0 && iSigRst >= 0 );
    if ( pIndexSet ) *pBitSet = 0;
    if ( pIndexRst ) *pBitRst = 0;
    if ( pBitSet )   *pBitSet = 0;
    if ( pBitRst )   *pBitRst = 0;
    if ( iSigSet == -1 || iSigRst == -1 )
        return 0;
    iSigSet = Prs_CreateBitSignal(pNtk, iSigSet);
    iSigRst = Prs_CreateBitSignal(pNtk, iSigRst);
    if ( iSigSet == -1 || iSigRst == -1 )
        return 0;
    if ( pIndexSet ) *pIndexSet = IndexSet;
    if ( pIndexRst ) *pIndexRst = IndexRst;
    if ( pBitSet )   *pBitSet = iSigSet;
    if ( pBitRst )   *pBitRst = iSigRst;
    return 1;
}